

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::javanano::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,EnumDescriptor *descriptor)

{
  Descriptor *pDVar1;
  string *name;
  Descriptor *parent;
  FileDescriptor *file;
  
  pDVar1 = *(Descriptor **)((long)&(params->empty_).field_2 + 8);
  if (this[0xd9] == (javanano)0x1) {
    name = (string *)(params->empty_)._M_dataplus._M_p;
    file = (FileDescriptor *)(params->empty_).field_2._M_allocated_capacity;
    parent = pDVar1;
  }
  else {
    if (pDVar1 == (Descriptor *)0x0) {
      ClassName_abi_cxx11_
                (__return_storage_ptr__,this,
                 (Params *)(params->empty_).field_2._M_allocated_capacity,
                 (FileDescriptor *)descriptor);
      return __return_storage_ptr__;
    }
    parent = *(Descriptor **)(pDVar1 + 0x18);
    name = *(string **)pDVar1;
    file = *(FileDescriptor **)(pDVar1 + 0x10);
  }
  ToJavaName(__return_storage_ptr__,(Params *)this,name,true,parent,file);
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Params& params, const EnumDescriptor* descriptor) {
  const Descriptor* parent = descriptor->containing_type();
  // When using Java enum style, an enum's class name contains the enum name.
  // Use the standard ToJavaName translation.
  if (params.java_enum_style()) {
    return ToJavaName(params, descriptor->name(), true, parent,
                      descriptor->file());
  }
  // Otherwise the enum members are accessed from the enclosing class.
  if (parent != NULL) {
    return ClassName(params, parent);
  } else {
    return ClassName(params, descriptor->file());
  }
}